

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::init(CreateContextExtCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  EGLDisplay pvVar1;
  Library *egl;
  _Vector_base<void_*,_std::allocator<void_*>_> _Stack_28;
  
  pvVar1 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar1;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::chooseConfigs((vector<void_*,_std::allocator<void_*>_> *)&_Stack_28,egl,this->m_display,
                      &this->m_filter);
  std::vector<void_*,_std::allocator<void_*>_>::_M_move_assign(&this->m_configs,&_Stack_28);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&_Stack_28);
  return extraout_EAX;
}

Assistant:

void CreateContextExtCase::init (void)
{
	m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs	= eglu::chooseConfigs(m_eglTestCtx.getLibrary(), m_display, m_filter);
}